

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t slotIndex;
  anon_struct_40_5_e253c8e7 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.slot = 0;
  gcFrame.result = 0;
  gcFrame.tuple = 0;
  gcFrame.name = 0;
  gcFrame.resultType = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.tuple =
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sVar1 = *(sysbvm_tuple_t *)(*arguments + 0x38);
  if (sVar1 == 0) {
    gcFrame.name = sysbvm_interpreter_evaluateASTWithEnvironment
                             (context,*(sysbvm_tuple_t *)(*arguments + 0x30),arguments[1]);
    sVar1 = sysbvm_tuple_getType(context,gcFrame.tuple);
    gcFrame.slot = sysbvm_type_lookupSlot(context,sVar1,gcFrame.name);
    sVar1 = gcFrame.slot;
    if (gcFrame.slot == 0) {
      sysbvm_error("Failed to find the slot with the specified name.");
      sVar1 = gcFrame.slot;
    }
  }
  gcFrame.slot = sVar1;
  sVar1 = gcFrame.slot;
  slotIndex = sysbvm_typeSlot_getIndex(gcFrame.slot);
  if ((sVar1 & 0xf) == 0 && sVar1 != 0) {
    gcFrame.resultType = *(sysbvm_tuple_t *)(sVar1 + 0x30);
  }
  else {
    gcFrame.resultType = 0;
  }
  gcFrame.result = sysbvm_tuple_slotAt(context,gcFrame.tuple,slotIndex);
  gcFrame.result = sysbvm_type_coerceValue(context,gcFrame.resultType,gcFrame.result);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_38);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtNode_t **node = (sysbvm_astTupleSlotNamedAtNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t name;
        sysbvm_tuple_t slot;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    if((*node)->boundSlot)
    {
        gcFrame.slot = (*node)->boundSlot;
    }
    else
    {
        gcFrame.name = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->nameExpression, *environment);
        gcFrame.slot = sysbvm_type_lookupSlot(context, sysbvm_tuple_getType(context, gcFrame.tuple), gcFrame.name);
        if(!gcFrame.slot)
            sysbvm_error("Failed to find the slot with the specified name.");
    }

    size_t slotIndex = sysbvm_typeSlot_getIndex(gcFrame.slot);
    gcFrame.resultType = sysbvm_typeSlot_getType(gcFrame.slot);
    gcFrame.result = sysbvm_tuple_slotAt(context, gcFrame.tuple, slotIndex);
    gcFrame.result = sysbvm_type_coerceValue(context, gcFrame.resultType, gcFrame.result);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}